

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_d195a::pp_lifo::emplace(pp_lifo *this,int variable,bool value)

{
  bool bVar1;
  __normal_iterator<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
  local_48;
  int *local_40;
  pp_variable_value *local_38;
  __normal_iterator<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
  local_30;
  __normal_iterator<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
  local_28;
  __normal_iterator<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
  it;
  bool value_local;
  int variable_local;
  pp_lifo *this_local;
  
  it._M_current._3_1_ = value;
  it._M_current._4_4_ = variable;
  local_30._M_current =
       (pp_variable_value *)
       std::
       vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
       ::cbegin(&this->data);
  local_38 = (pp_variable_value *)
             std::
             vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
             ::cend(&this->data);
  local_40 = (int *)((long)&it._M_current + 4);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<(anonymous_namespace)::pp_variable_value_const*,std::vector<(anonymous_namespace)::pp_variable_value,std::allocator<(anonymous_namespace)::pp_variable_value>>>,(anonymous_namespace)::pp_lifo::emplace(int,bool)::_lambda(auto:1_const&)_1_>
                       (local_30,(__normal_iterator<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
                                  )local_38,(anon_class_8_1_9d70f7fa_for__M_pred)local_40);
  local_48._M_current =
       (pp_variable_value *)
       std::
       vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
       ::cend(&this->data);
  bVar1 = __gnu_cxx::
          operator==<const_(anonymous_namespace)::pp_variable_value_*,_std::vector<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>_>
                    (&local_28,&local_48);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    std::
    vector<(anonymous_namespace)::pp_variable_value,std::allocator<(anonymous_namespace)::pp_variable_value>>
    ::emplace_back<int&,bool&>
              ((vector<(anonymous_namespace)::pp_variable_value,std::allocator<(anonymous_namespace)::pp_variable_value>>
                *)this,(int *)((long)&it._M_current + 4),(bool *)((long)&it._M_current + 3));
  }
  return bVar1;
}

Assistant:

bool emplace(int variable, bool value)
    {
        auto it = std::find_if(
          data.cbegin(), data.cend(), [&variable](const auto& elem) {
              return elem.index == variable;
          });

        if (it != data.cend())
            return false;

        data.emplace_back(variable, value);

        return true;
    }